

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_suite.cpp
# Opt level: O2

void __thiscall sqlcheck::TestSuite_QueryTests_Test::TestBody(TestSuite_QueryTests_Test *this)

{
  long lVar1;
  unique_ptr<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  this_00;
  Configuration default_conf;
  allocator local_c9;
  string local_c8 [32];
  Configuration local_a8;
  
  Configuration::Configuration(&local_a8);
  local_a8.testing_mode = true;
  local_a8.verbose = false;
  this_00._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )operator_new(0x180);
  std::__cxx11::istringstream::istringstream
            ((istringstream *)
             this_00._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl);
  std::__cxx11::string::string
            (local_c8,
             "SELECT * FROM Bugs WHERE assigned_to IS NULL OR assigned_to <> 1;\nSELECT first_name || \' \' || last_name AS full_name FROM Accounts;\nSELECT product_id, MAX(date_reported) AS latest,MIN(date_reported) AS earliest, bug_idFROM Bugs JOIN BugsProducts USING (bug_id)GROUP BY product_id;\nSELECT product_id, MAX(date_reported) AS latestFROM Bugs JOIN BugsProducts USING (bug_id)GROUP BY product_id;\nSELECT * FROM Bugs ORDER BY RAND() LIMIT 1;\nSELECT b1.*FROM Bugs AS b1JOIN (SELECT CEIL(RAND() * (SELECT MAX(bug_id) FROM Bugs)) AS rand_id) AS b2ON (b1.bug_id = b2.rand_id);\nSELECT * FROM Bugs WHERE description LIKE \'%crash%\';\nSELECT * FROM Bugs WHERE description REGEXP \'crash\';\nSELECT COUNT(bp.product_id) AS how_many_products,COUNT(dev.account_id) AS how_many_developers,COUNT(b.bug_id)/COUNT(dev.account_id) AS avg_bugs_per_developer,COUNT(cust.account_id) AS how_many_customersFROM Bugs b JOIN BugsProducts bp ON (b.bug_id = bp.bug_id)JOIN Accounts dev ON (b.assigned_to = dev.account_id)JOIN Accounts cust ON (b.reported_by = cust.account_id) WHERE cust.email NOT LIKE \'%@example.com\'JOIN Accounts cust ON (b.reported_by = cust.account_id) WHERE cust.email NOT LIKE \'%@example.com\'JOIN Accounts cust ON (b.reported_by = cust.account_id) WHERE cust.email NOT LIKE \'%@example.com\'JOIN Accounts cust ON (b.reported_by = cust.account_id) WHERE cust.email NOT LIKE \'%@example.com\'JOIN Accounts cust ON (b.reported_by = cust.account_id) WHERE cust.email NOT LIKE \'%@example.com\'GROUP BY bp.product_id;SELECT AVG(bugs_per_developer) AS average_bugs_per_developerFROM (SELECT dev.account_id, COUNT(*) AS bugs_per_developerFROM Bugs b JOIN Accounts devON (b.assigned_to = dev.account_id)WHERE b.status = \'FIXED\' GROUP BY dev.account_id) t;\nINSERT INTO Bugs VALUES (DEFAULT, CURDATE(), \'New bug\', \'Test T987 fails...\',NULL, 123, NULL, NULL, DEFAULT, \'Medium\', NULL);\nINSERT INTO Accounts (account_name, first_name, last_name, email,password_hash, portrait_image, hourly_rate)VALUES (\'bkarwin\', \'Bill\', \'Karwin\', \'bill@example.com\', SHA2(\'xyzzy\'), NULL, 49.95);..." /* TRUNCATED STRING LITERAL */
             ,&local_c9);
  std::__cxx11::stringbuf::str
            ((string *)
             ((long)this_00._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl + 0x10));
  std::__cxx11::string::~string(local_c8);
  if ((__uniq_ptr_impl<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_a8.test_stream._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
      (__uniq_ptr_impl<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0) {
    lVar1 = *(long *)local_a8.test_stream._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl;
    local_a8.test_stream._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         this_00._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
    (**(code **)(lVar1 + 8))();
    this_00._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )local_a8.test_stream;
  }
  local_a8.test_stream._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this_00;
  Check(&local_a8);
  Configuration::~Configuration(&local_a8);
  return;
}

Assistant:

TEST(TestSuite, QueryTests) {

  Configuration default_conf;
  default_conf.testing_mode = true;
  default_conf.verbose = false;

  std::unique_ptr<std::istringstream> stream(new std::istringstream());
  stream->str(

      "SELECT * FROM Bugs WHERE assigned_to IS NULL OR assigned_to <> 1;\n"

      "SELECT first_name || ' ' || last_name AS full_name FROM Accounts;\n"

      "SELECT product_id, MAX(date_reported) AS latest,"
      "MIN(date_reported) AS earliest, bug_id"
      "FROM Bugs JOIN BugsProducts USING (bug_id)"
      "GROUP BY product_id;\n"

      "SELECT product_id, MAX(date_reported) AS latest"
      "FROM Bugs JOIN BugsProducts USING (bug_id)"
      "GROUP BY product_id;\n"

      "SELECT * FROM Bugs ORDER BY RAND() LIMIT 1;\n"

      "SELECT b1.*"
      "FROM Bugs AS b1"
      "JOIN (SELECT CEIL(RAND() * (SELECT MAX(bug_id) FROM Bugs)) AS rand_id) AS b2"
      "ON (b1.bug_id = b2.rand_id);\n"

      "SELECT * FROM Bugs WHERE description LIKE '%crash%';\n"

      "SELECT * FROM Bugs WHERE description REGEXP 'crash';\n"

      "SELECT COUNT(bp.product_id) AS how_many_products,"
      "COUNT(dev.account_id) AS how_many_developers,"
      "COUNT(b.bug_id)/COUNT(dev.account_id) AS avg_bugs_per_developer,"
      "COUNT(cust.account_id) AS how_many_customers"
      "FROM Bugs b JOIN BugsProducts bp ON (b.bug_id = bp.bug_id)"
      "JOIN Accounts dev ON (b.assigned_to = dev.account_id)"
      "JOIN Accounts cust ON (b.reported_by = cust.account_id) WHERE cust.email NOT LIKE '%@example.com'"
      "JOIN Accounts cust ON (b.reported_by = cust.account_id) WHERE cust.email NOT LIKE '%@example.com'"
      "JOIN Accounts cust ON (b.reported_by = cust.account_id) WHERE cust.email NOT LIKE '%@example.com'"
      "JOIN Accounts cust ON (b.reported_by = cust.account_id) WHERE cust.email NOT LIKE '%@example.com'"
      "JOIN Accounts cust ON (b.reported_by = cust.account_id) WHERE cust.email NOT LIKE '%@example.com'"
      "GROUP BY bp.product_id;"

      "SELECT AVG(bugs_per_developer) AS average_bugs_per_developer"
      "FROM (SELECT dev.account_id, COUNT(*) AS bugs_per_developer"
      "FROM Bugs b JOIN Accounts dev"
      "ON (b.assigned_to = dev.account_id)"
      "WHERE b.status = 'FIXED' GROUP BY dev.account_id) t;\n"

      "INSERT INTO Bugs VALUES (DEFAULT, CURDATE(), 'New bug', 'Test T987 fails...',"
      "NULL, 123, NULL, NULL, DEFAULT, 'Medium', NULL);\n"

      "INSERT INTO Accounts (account_name, first_name, last_name, email,"
      "password_hash, portrait_image, hourly_rate)"
      "VALUES ('bkarwin', 'Bill', 'Karwin', 'bill@example.com', SHA2('xyzzy'), NULL, 49.95);\n"

      "CREATE TABLE Accounts ("
      "account_id    SERIAL PRIMARY KEY,"
      "account_name  VARCHAR(20) NOT NULL,"
      "email         VARCHAR(100) NOT NULL,"
      "password      VARCHAR(30) NOT NULL"
      ");\n"

      "SELECT * FROM Accounts"
      "WHERE account_name = 'bill' AND password = 'opensesame';\n"

      "SELECT s.cust_id,count(s.cust_id) FROM  SH.sales s GROUP BY s.cust_id\n"
      "HAVING s.cust_id != '1660' AND s.cust_id != '2';\n"

      "SELECT * FROM SH.products p WHERE p.prod_id = (SELECT s.prod_id FROM SH.sales s"
      "WHERE s.cust_id = 100996 AND s.quantity_sold = 1 );\n"

      "SELECT s.* FROM SH.sales s WHERE s.prod_id = 14 OR s.prod_id = 17;\n"

      "SELECT cust_id FROM SH.sales UNION SELECT cust_id FROM customers;\n"

      "SELECT DISTINCT c.country_id, c.country_name FROM SH.countries c JOIN SH.customers e"
      "WHERE e.country_id = c.country_id;\n"

  );

  default_conf.test_stream.reset(stream.release());

  Check(default_conf);

}